

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O1

wchar_t scan_items(object **item_list,size_t item_max,player *p,wchar_t mode,item_tester tester)

{
  ulong uVar1;
  ushort uVar2;
  _Bool _Var3;
  wchar_t wVar4;
  object **items;
  object *poVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar2 = z_info->floor_size;
  items = (object **)mem_zalloc((ulong)((uint)uVar2 * 8));
  if (((mode & 2U) == 0) || (item_max == 0 || z_info->pack_size == 0)) {
    uVar9 = 0;
  }
  else {
    uVar7 = 1;
    uVar9 = 0;
    do {
      _Var3 = object_test(tester,p->upkeep->inven[uVar7 - 1]);
      if (_Var3) {
        item_list[uVar9] = p->upkeep->inven[uVar7 - 1];
        uVar9 = uVar9 + 1;
      }
    } while ((uVar7 < z_info->pack_size) && (uVar7 = uVar7 + 1, uVar9 < item_max));
  }
  if (((mode & 1U) != 0) && (uVar9 < item_max && (p->body).count != 0)) {
    uVar8 = 1;
    do {
      poVar5 = slot_object(p,uVar8 + L'\xffffffff');
      _Var3 = object_test(tester,poVar5);
      if (_Var3) {
        poVar5 = slot_object(p,uVar8 + L'\xffffffff');
        item_list[uVar9] = poVar5;
        uVar9 = uVar9 + 1;
      }
    } while ((uVar8 < (p->body).count) && (uVar8 = uVar8 + 1, uVar9 < item_max));
  }
  if (((mode & 8U) != 0) && ((z_info->quiver_size != 0 && (uVar9 < item_max)))) {
    uVar7 = 1;
    do {
      _Var3 = object_test(tester,p->upkeep->quiver[uVar7 - 1]);
      if (_Var3) {
        item_list[uVar9] = p->upkeep->quiver[uVar7 - 1];
        uVar9 = uVar9 + 1;
      }
    } while ((uVar7 < z_info->quiver_size) && (uVar7 = uVar7 + 1, uVar9 < item_max));
  }
  if (((mode & 4U) != 0) &&
     ((wVar4 = scan_floor(items,(uint)uVar2,p,OFLOOR_VISIBLE|OFLOOR_SENSE|OFLOOR_TEST,tester),
      L'\0' < wVar4 && (uVar9 < item_max)))) {
    uVar7 = 1;
    do {
      item_list[uVar9 + (uVar7 - 1)] = items[uVar7 - 1];
      uVar1 = uVar7 + 1;
      if ((uint)wVar4 <= uVar7) break;
      uVar6 = uVar7 + uVar9;
      uVar7 = uVar1;
    } while (uVar6 < item_max);
    uVar9 = (uVar9 + uVar1) - 1;
  }
  mem_free(items);
  return (wchar_t)uVar9;
}

Assistant:

int scan_items(struct object **item_list, size_t item_max, struct player *p,
		int mode, item_tester tester)
{
	bool use_inven = ((mode & USE_INVEN) ? true : false);
	bool use_equip = ((mode & USE_EQUIP) ? true : false);
	bool use_quiver = ((mode & USE_QUIVER) ? true : false);
	bool use_floor = ((mode & USE_FLOOR) ? true : false);

	int floor_max = z_info->floor_size;
	struct object **floor_list = mem_zalloc(floor_max * sizeof(struct object *));
	int floor_num;

	int i;
	size_t item_num = 0;

	if (use_inven)
		for (i = 0; i < z_info->pack_size && item_num < item_max; i++) {
			if (object_test(tester, p->upkeep->inven[i]))
				item_list[item_num++] = p->upkeep->inven[i];
		}

	if (use_equip)
		for (i = 0; i < p->body.count && item_num < item_max; i++) {
			if (object_test(tester, slot_object(p, i)))
				item_list[item_num++] = slot_object(p, i);
		}

	if (use_quiver)
		for (i = 0; i < z_info->quiver_size && item_num < item_max; i++) {
			if (object_test(tester, p->upkeep->quiver[i]))
				item_list[item_num++] = p->upkeep->quiver[i];
		}

	/* Scan all non-gold objects in the grid */
	if (use_floor) {
		floor_num = scan_floor(floor_list, floor_max, p,
			OFLOOR_TEST | OFLOOR_SENSE | OFLOOR_VISIBLE, tester);

		for (i = 0; i < floor_num && item_num < item_max; i++)
			item_list[item_num++] = floor_list[i];
	}

	mem_free(floor_list);
	return item_num;
}